

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error
ft_stroke_border_get_counts
          (PVG_FT_StrokeBorder border,PVG_FT_UInt *anum_points,PVG_FT_UInt *anum_contours)

{
  byte bVar1;
  PVG_FT_UInt PVar2;
  PVG_FT_UInt PVar3;
  PVG_FT_UInt PVar4;
  PVG_FT_UInt PVar5;
  long lVar6;
  bool bVar7;
  
  PVar2 = border->num_points;
  if (PVar2 == 0) {
    PVar4 = 0;
  }
  else {
    PVar3 = 0;
    lVar6 = 0;
    bVar7 = false;
    PVar4 = 0;
    do {
      bVar1 = border->tags[lVar6];
      if (((bVar1 & 4) == 0) == !bVar7) {
        PVar5 = 0;
        goto LAB_0013e208;
      }
      bVar7 = (bVar1 & 8) == 0;
      PVar4 = PVar4 + ((bVar1 & 8) >> 3);
      lVar6 = lVar6 + 1;
    } while (PVar2 != (PVG_FT_UInt)lVar6);
    PVar5 = 0;
    if ((char)(bVar1 & 8) == '\0') goto LAB_0013e208;
  }
  border->valid = '\x01';
  PVar3 = PVar2;
  PVar5 = PVar4;
LAB_0013e208:
  *anum_points = PVar3;
  *anum_contours = PVar5;
  return PVar2;
}

Assistant:

static PVG_FT_Error ft_stroke_border_get_counts(PVG_FT_StrokeBorder border,
                                               PVG_FT_UInt*        anum_points,
                                               PVG_FT_UInt*        anum_contours)
{
    PVG_FT_Error error = 0;
    PVG_FT_UInt  num_points = 0;
    PVG_FT_UInt  num_contours = 0;

    PVG_FT_UInt    count = border->num_points;
    PVG_FT_Vector* point = border->points;
    PVG_FT_Byte*   tags = border->tags;
    PVG_FT_Int     in_contour = 0;

    for (; count > 0; count--, num_points++, point++, tags++) {
        if (tags[0] & PVG_FT_STROKE_TAG_BEGIN) {
            if (in_contour != 0) goto Fail;

            in_contour = 1;
        } else if (in_contour == 0)
            goto Fail;

        if (tags[0] & PVG_FT_STROKE_TAG_END) {
            in_contour = 0;
            num_contours++;
        }
    }

    if (in_contour != 0) goto Fail;

    border->valid = TRUE;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;

Fail:
    num_points = 0;
    num_contours = 0;
    goto Exit;
}